

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linde_buzo_gray_algorithm.cc
# Opt level: O0

bool __thiscall
sptk::LindeBuzoGrayAlgorithm::Run
          (LindeBuzoGrayAlgorithm *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *codebook_vectors,vector<int,_std::allocator<int>_> *codebook_indices,
          double *total_distance)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  DistanceCalculation *this_00;
  double *distance_00;
  const_reference vector2;
  reference pvVar7;
  vector<int,_std::allocator<int>_> *in_RCX;
  allocator_type *in_RDX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  long in_RDI;
  double *in_R8;
  double dVar8;
  double dVar9;
  int t_1;
  int j_1;
  double perturbation_1;
  double random_value_1;
  int m_1;
  int num_vector_1;
  int i_3;
  int num_vector;
  int i_2;
  int max_num_vector_in_cluster;
  int majority_index;
  double criterion_value;
  double distance;
  int index;
  int t;
  int i_1;
  double sum;
  int n;
  double prev_total_distance;
  int j;
  double perturbation;
  double random_value;
  int m;
  int i;
  iterator itr;
  int next_codebook_size;
  int current_codebook_size;
  NormalDistributedRandomValueGeneration random_value_generation;
  vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
  buffers;
  int num_input_vector;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  NormalDistributedRandomValueGeneration *in_stack_fffffffffffffdc0;
  NormalDistributedRandomValueGeneration *in_stack_fffffffffffffdc8;
  allocator_type *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  StatisticsAccumulation *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  VectorQuantization *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  undefined4 in_stack_fffffffffffffe40;
  value_type vVar10;
  int local_158;
  double local_148;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  double local_120;
  double local_118;
  value_type local_10c;
  int local_108;
  int local_104;
  double local_100;
  int local_f4;
  double local_f0;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  double local_d0;
  int local_c8;
  int local_c4;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_b0;
  int local_a8;
  int local_a4;
  vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
  local_50;
  int local_34;
  double *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  allocator_type *local_20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_18;
  byte local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(in_RSI);
  local_34 = (int)sVar3;
  if ((((((*(byte *)(in_RDI + 0x98) & 1) == 0) ||
        (local_34 < *(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x10))) ||
       (local_20 == (allocator_type *)0x0)) ||
      ((local_28 == (vector<int,_std::allocator<int>_> *)0x0 || (local_30 == (double *)0x0)))) ||
     (sVar3 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)local_20), sVar3 != (long)*(int *)(in_RDI + 0xc))) {
    local_1 = 0;
  }
  else {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(local_28);
    if (sVar3 != (long)local_34) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    }
    std::allocator<sptk::StatisticsAccumulation::Buffer>::allocator
              ((allocator<sptk::StatisticsAccumulation::Buffer> *)0x129e08);
    std::
    vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
    ::vector((vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
              *)in_stack_fffffffffffffde0,
             CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),in_stack_fffffffffffffdd0
            );
    std::allocator<sptk::StatisticsAccumulation::Buffer>::~allocator
              ((allocator<sptk::StatisticsAccumulation::Buffer> *)0x129e34);
    NormalDistributedRandomValueGeneration::NormalDistributedRandomValueGeneration
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    *local_30 = 1.79769313486232e+308;
    local_a4 = *(int *)(in_RDI + 0xc);
    local_a8 = local_a4;
LAB_00129e84:
    local_a8 = local_a8 << 1;
    if (local_a8 <= *(int *)(in_RDI + 0x10)) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffde0,
               CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      local_b0 = __gnu_cxx::
                 __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator+((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                              *)in_stack_fffffffffffffdc8,(difference_type)in_stack_fffffffffffffdc0
                            );
      while( true ) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                            *)in_stack_fffffffffffffdc0,
                           (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator->(&local_b0);
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffde0,
                   CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator++(&local_b0);
      }
      for (local_c4 = 0; local_c4 < local_a4; local_c4 = local_c4 + 1) {
        for (local_c8 = 0; local_c8 <= *(int *)(in_RDI + 8); local_c8 = local_c8 + 1) {
          bVar2 = NormalDistributedRandomValueGeneration::Get
                            (in_stack_fffffffffffffdc8,(double *)in_stack_fffffffffffffdc0);
          if (!bVar2) {
            local_1 = 0;
            goto LAB_0012a974;
          }
          in_stack_ffffffffffffff20 =
               (vector<double,_std::allocator<double>_> *)(*(double *)(in_RDI + 0x28) * local_d0);
          in_stack_ffffffffffffff1c = local_c4 + local_a4;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_20,(long)local_c4);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_c8);
          dVar8 = *pvVar5 - (double)in_stack_ffffffffffffff20;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_20,(long)in_stack_ffffffffffffff1c);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_c8);
          *pvVar5 = dVar8;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_20,(long)local_c4);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_c8);
          dVar8 = *pvVar5 + (double)in_stack_ffffffffffffff20;
          pvVar4 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)local_20,(long)local_c4);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_c8);
          *pvVar5 = dVar8;
        }
      }
      local_a4 = local_a8;
      local_f0 = 1.79769313486232e+308;
      for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x18); local_f4 = local_f4 + 1) {
        local_100 = 0.0;
        for (local_104 = 0; local_104 < local_a4; local_104 = local_104 + 1) {
          std::
          vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
          ::operator[](&local_50,(long)local_104);
          StatisticsAccumulation::Clear
                    ((StatisticsAccumulation *)in_stack_fffffffffffffdc0,
                     (Buffer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        }
        for (local_108 = 0; local_108 < local_34; local_108 = local_108 + 1) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[](local_18,(long)local_108);
          bVar2 = VectorQuantization::Run
                            (in_stack_fffffffffffffe08,
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)in_stack_fffffffffffffdf8,
                             (int *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
          if (!bVar2) {
            local_1 = 0;
            goto LAB_0012a974;
          }
          vVar10 = local_10c;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_108);
          *pvVar6 = vVar10;
          this_00 = (DistanceCalculation *)(in_RDI + 0x50);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[](local_18,(long)local_108);
          std::
          vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
          ::operator[](&local_50,(long)local_10c);
          bVar2 = StatisticsAccumulation::Run
                            ((StatisticsAccumulation *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                             in_stack_ffffffffffffff20,
                             (Buffer *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                            );
          if (!bVar2) {
            local_1 = 0;
            goto LAB_0012a974;
          }
          distance_00 = (double *)(in_RDI + 0x38);
          vector2 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](local_18,(long)local_108);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)local_20,(long)local_10c);
          bVar2 = DistanceCalculation::Run
                            (this_00,(vector<double,_std::allocator<double>_> *)
                                     CONCAT44(vVar10,in_stack_fffffffffffffe40),vector2,distance_00)
          ;
          in_stack_fffffffffffffe40 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe40);
          if (!bVar2) {
            local_1 = 0;
            goto LAB_0012a974;
          }
          local_100 = local_118 + local_100;
        }
        *local_30 = local_100 / (double)local_34;
        local_120 = ABS(local_f0 - *local_30) / *local_30;
        if (((*local_30 == 0.0) && (!NAN(*local_30))) || (local_120 < *(double *)(in_RDI + 0x20)))
        break;
        local_f0 = *local_30;
        local_124 = -1;
        local_128 = 0;
        for (local_12c = 0; local_12c < local_a4; local_12c = local_12c + 1) {
          pvVar7 = std::
                   vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                   ::operator[](&local_50,(long)local_12c);
          bVar2 = StatisticsAccumulation::GetNumData
                            ((StatisticsAccumulation *)(in_RDI + 0x50),pvVar7,&local_130);
          if (!bVar2) {
            local_1 = 0;
            goto LAB_0012a974;
          }
          if (local_128 < local_130) {
            local_124 = local_12c;
            local_128 = local_130;
          }
          if (*(int *)(in_RDI + 0x14) <= local_130) {
            in_stack_fffffffffffffe08 = (VectorQuantization *)(in_RDI + 0x50);
            pvVar7 = std::
                     vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                     ::operator[](&local_50,(long)local_12c);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)local_20,(long)local_12c);
            in_stack_fffffffffffffe1f =
                 StatisticsAccumulation::GetMean
                           ((StatisticsAccumulation *)
                            CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),pvVar7,
                            (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe08);
            if (!(bool)in_stack_fffffffffffffe1f) {
              local_1 = 0;
              goto LAB_0012a974;
            }
          }
        }
        for (local_134 = 0; local_134 < local_a4; local_134 = local_134 + 1) {
          in_stack_fffffffffffffdf8 = (StatisticsAccumulation *)(in_RDI + 0x50);
          pvVar7 = std::
                   vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
                   ::operator[](&local_50,(long)local_134);
          in_stack_fffffffffffffe07 =
               StatisticsAccumulation::GetNumData(in_stack_fffffffffffffdf8,pvVar7,&local_138);
          if (!(bool)in_stack_fffffffffffffe07) {
            local_1 = 0;
            goto LAB_0012a974;
          }
          if (local_138 < *(int *)(in_RDI + 0x14)) {
            for (local_13c = 0; local_13c <= *(int *)(in_RDI + 8); local_13c = local_13c + 1) {
              in_stack_fffffffffffffdf7 =
                   NormalDistributedRandomValueGeneration::Get
                             (in_stack_fffffffffffffdc8,(double *)in_stack_fffffffffffffdc0);
              iVar1 = local_124;
              if (!(bool)in_stack_fffffffffffffdf7) {
                local_1 = 0;
                goto LAB_0012a974;
              }
              dVar9 = *(double *)(in_RDI + 0x28) * local_148;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)local_20,(long)local_124);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_13c);
              in_stack_fffffffffffffde0 =
                   (vector<double,_std::allocator<double>_> *)(*pvVar5 - dVar9);
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)local_20,(long)local_134);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_13c);
              *pvVar5 = (value_type)in_stack_fffffffffffffde0;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)local_20,(long)iVar1);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_13c);
              dVar8 = *pvVar5;
              pvVar4 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)local_20,(long)iVar1);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)local_13c);
              *pvVar5 = dVar8 + dVar9;
            }
          }
        }
      }
      goto LAB_00129e84;
    }
    for (local_158 = 0; local_158 < local_34; local_158 = local_158 + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](local_18,(long)local_158);
      in_stack_fffffffffffffdd0 = local_20;
      std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_158);
      bVar2 = VectorQuantization::Run
                        (in_stack_fffffffffffffe08,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)in_stack_fffffffffffffdf8,
                         (int *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      if (!bVar2) {
        local_1 = 0;
        goto LAB_0012a974;
      }
    }
    local_1 = 1;
LAB_0012a974:
    NormalDistributedRandomValueGeneration::~NormalDistributedRandomValueGeneration
              ((NormalDistributedRandomValueGeneration *)0x12a981);
    std::
    vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
    ::~vector((vector<sptk::StatisticsAccumulation::Buffer,_std::allocator<sptk::StatisticsAccumulation::Buffer>_>
               *)in_stack_fffffffffffffdd0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LindeBuzoGrayAlgorithm::Run(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<std::vector<double> >* codebook_vectors,
    std::vector<int>* codebook_indices, double* total_distance) const {
  // Check inputs.
  const int num_input_vector(static_cast<int>(input_vectors.size()));
  if (!is_valid_ ||
      num_input_vector < min_num_vector_in_cluster_ * target_codebook_size_ ||
      NULL == codebook_vectors || NULL == codebook_indices ||
      NULL == total_distance ||
      codebook_vectors->size() !=
          static_cast<std::size_t>(initial_codebook_size_)) {
    return false;
  }

  // Prepare memories.
  if (codebook_indices->size() != static_cast<std::size_t>(num_input_vector)) {
    codebook_indices->resize(num_input_vector);
  }
  std::vector<StatisticsAccumulation::Buffer> buffers(target_codebook_size_);

  // Prepare random value generator.
  NormalDistributedRandomValueGeneration random_value_generation(seed_);

  *total_distance = sptk::kMax;

  // Design codebook.
  int current_codebook_size(initial_codebook_size_);
  for (int next_codebook_size(current_codebook_size * 2);
       next_codebook_size <= target_codebook_size_; next_codebook_size *= 2) {
    // Double codebook size.
    codebook_vectors->resize(next_codebook_size);
    for (std::vector<std::vector<double> >::iterator itr(
             codebook_vectors->begin() + current_codebook_size);
         itr != codebook_vectors->end(); ++itr) {
      itr->resize(num_order_ + 1);
    }

    // Perturb codebook vectors.
    for (int i(0); i < current_codebook_size; ++i) {
      for (int m(0); m <= num_order_; ++m) {
        double random_value;
        if (!random_value_generation.Get(&random_value)) {
          return false;
        }
        const double perturbation(splitting_factor_ * random_value);
        const int j(i + current_codebook_size);
        (*codebook_vectors)[j][m] = (*codebook_vectors)[i][m] - perturbation;
        (*codebook_vectors)[i][m] = (*codebook_vectors)[i][m] + perturbation;
      }
    }

    current_codebook_size = next_codebook_size;

    double prev_total_distance(sptk::kMax);
    for (int n(0); n < num_iteration_; ++n) {
      // Initialize.
      double sum(0.0);
      for (int i(0); i < current_codebook_size; ++i) {
        statistics_accumulation_.Clear(&(buffers[i]));
      }

      // Accumulate statistics (E-step).
      for (int t(0); t < num_input_vector; ++t) {
        int index;
        if (!vector_quantization_.Run(input_vectors[t], *codebook_vectors,
                                      &index)) {
          return false;
        }
        (*codebook_indices)[t] = index;

        if (!statistics_accumulation_.Run(input_vectors[t],
                                          &(buffers[index]))) {
          return false;
        }

        double distance;
        if (!distance_calculation_.Run(input_vectors[t],
                                       (*codebook_vectors)[index], &distance)) {
          return false;
        }
        sum += distance;
      }
      *total_distance = sum / num_input_vector;

      // Check convergence.
      const double criterion_value(
          std::fabs(prev_total_distance - *total_distance) / *total_distance);
      if (0.0 == *total_distance || criterion_value < convergence_threshold_) {
        break;
      }
      prev_total_distance = *total_distance;

      // Update codebook (M-step) and find a maximum cluster.
      int majority_index(-1);
      int max_num_vector_in_cluster(0);
      for (int i(0); i < current_codebook_size; ++i) {
        int num_vector;
        if (!statistics_accumulation_.GetNumData(buffers[i], &num_vector)) {
          return false;
        }

        if (max_num_vector_in_cluster < num_vector) {
          majority_index = i;
          max_num_vector_in_cluster = num_vector;
        }

        // Update if the cluster contains enough data.
        if (min_num_vector_in_cluster_ <= num_vector) {
          if (!statistics_accumulation_.GetMean(buffers[i],
                                                &((*codebook_vectors)[i]))) {
            return false;
          }
        }
      }

      // Update the remaining centroids.
      for (int i(0); i < current_codebook_size; ++i) {
        int num_vector;
        if (!statistics_accumulation_.GetNumData(buffers[i], &num_vector)) {
          return false;
        }

        if (num_vector < min_num_vector_in_cluster_) {
          for (int m(0); m <= num_order_; ++m) {
            double random_value;
            if (!random_value_generation.Get(&random_value)) {
              return false;
            }
            const double perturbation(splitting_factor_ * random_value);
            const int j(majority_index);
            (*codebook_vectors)[i][m] =
                (*codebook_vectors)[j][m] - perturbation;
            (*codebook_vectors)[j][m] =
                (*codebook_vectors)[j][m] + perturbation;
          }
        }
      }
    }
  }

  // Save final results.
  for (int t(0); t < num_input_vector; ++t) {
    if (!vector_quantization_.Run(input_vectors[t], *codebook_vectors,
                                  &((*codebook_indices)[t]))) {
      return false;
    }
  }

  return true;
}